

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::OnImportGlobal
          (BinaryReaderObjdump *this,Index import_index,string_view module_name,
          string_view field_name,Index global_index,Type type,bool mutable_)

{
  char *pcVar1;
  
  pcVar1 = Type::GetName(&type);
  PrintDetails(this," - global[%u] %s mutable=%d",(ulong)global_index,pcVar1,(ulong)mutable_);
  PrintDetails(this," <- %.*s.%.*s\n",module_name.size_ & 0xffffffff,module_name.data_,
               field_name.size_ & 0xffffffff,field_name.data_);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnImportGlobal(Index import_index,
                                           string_view module_name,
                                           string_view field_name,
                                           Index global_index,
                                           Type type,
                                           bool mutable_) {
  PrintDetails(" - global[%" PRIindex "] %s mutable=%d", global_index,
               type.GetName(), mutable_);
  PrintDetails(" <- " PRIstringview "." PRIstringview "\n",
               WABT_PRINTF_STRING_VIEW_ARG(module_name),
               WABT_PRINTF_STRING_VIEW_ARG(field_name));
  return Result::Ok;
}